

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_94e0e::MinKernel::aggregate
          (MinKernel *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  pointer pEVar1;
  Node *pNVar2;
  cali_id_t cVar3;
  int iVar4;
  undefined4 extraout_var;
  Attribute AVar6;
  cali_id_t cVar7;
  cali_id_t cVar8;
  Entry *e;
  Config *this_00;
  pointer pEVar9;
  Variant local_48;
  Node *pNVar5;
  
  std::mutex::lock(&this->m_lock);
  this_00 = this->m_config;
  pNVar5 = (this_00->m_target_attr).m_node;
  if (pNVar5 == (Node *)0x0) {
    iVar4 = (*db->_vptr_CaliperMetadataAccessInterface[2])(db,&this_00->m_target_attr_name);
    pNVar5 = (Node *)CONCAT44(extraout_var,iVar4);
    (this_00->m_target_attr).m_node = pNVar5;
    this_00 = this->m_config;
  }
  AVar6 = Config::get_min_attr(this_00,db);
  if (AVar6.m_node != (Node *)0x0) {
    pEVar1 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    cVar3 = 0xffffffffffffffff;
    for (pEVar9 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
                  super__Vector_impl_data._M_start; pEVar9 != pEVar1; pEVar9 = pEVar9 + 1) {
      pNVar2 = pEVar9->m_node;
      cVar7 = cVar3;
      if ((pNVar2 != (Node *)0x0) && (cVar7 = pNVar2->m_attribute, cVar7 == 8)) {
        cVar7 = pNVar2->m_id;
      }
      cVar8 = cVar3;
      if (pNVar5 != (Node *)0x0) {
        cVar8 = pNVar5->m_id;
      }
      if (cVar7 == cVar8) {
LAB_001c3529:
        local_48.m_v.type_and_size = (pEVar9->m_value).m_v.type_and_size;
        local_48.m_v.value = (pEVar9->m_value).m_v.value;
        cali::Variant::min(&this->m_min,&local_48);
      }
      else {
        cVar7 = cVar3;
        if ((pNVar2 != (Node *)0x0) && (cVar7 = pNVar2->m_attribute, cVar7 == 8)) {
          cVar7 = pNVar2->m_id;
        }
        if (cVar7 == (AVar6.m_node)->m_id) goto LAB_001c3529;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return;
}

Assistant:

virtual void aggregate(CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        std::lock_guard<std::mutex> g(m_lock);

        Attribute target_attr = m_config->get_target_attr(db);
        Attribute min_attr    = m_config->get_min_attr(db);

        if (!min_attr)
            return;

        for (const Entry& e : list) {
            if (e.attribute() == target_attr.id() || e.attribute() == min_attr.id())
                m_min.min(e.value());
        }
    }